

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O2

void __thiscall TextProviderString::reverse(TextProviderString *this)

{
  int *piVar1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var3;
  
  iVar2 = (*(this->super_TextProvider)._vptr_TextProvider[2])();
  if (((char)iVar2 != '\0') &&
     ((this->m_iterator).
      super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged == true)) {
    piVar1 = &(this->super_TextProvider).m_current_char_idx;
    *piVar1 = *piVar1 + -1;
    p_Var3 = std::
             optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value(&this->m_iterator);
    p_Var3->_M_current = p_Var3->_M_current + -1;
    p_Var3 = std::
             optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value(&this->m_iterator);
    (this->super_TextProvider).m_current_char = *p_Var3->_M_current;
  }
  return;
}

Assistant:

void TextProviderString::reverse()
{
	if(is_valid() && m_iterator.has_value())
	{
		--m_current_char_idx;
		--m_iterator.value();
		m_current_char = *m_iterator.value();
	}
}